

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::UnderscoresToCamelCase
                   (string *__return_storage_ptr__,string *name,bool cap_first_letter)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  int i;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    pcVar2 = (name->_M_dataplus)._M_p;
    cVar3 = (char)__return_storage_ptr__;
    if (name->_M_string_length <= uVar4) {
      if (pcVar2[name->_M_string_length - 1] == '#') {
        std::__cxx11::string::push_back(cVar3);
      }
      return __return_storage_ptr__;
    }
    bVar1 = pcVar2[uVar4];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((byte)(bVar1 - 0x30) < 10) {
          std::__cxx11::string::push_back(cVar3);
        }
      }
      else if (bVar1 < 0x5b) goto LAB_0029edc0;
    }
    else if (bVar1 < 0x7b) {
LAB_0029edc0:
      std::__cxx11::string::push_back(cVar3);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::string UnderscoresToCamelCase(const string& name, bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}